

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::MergePartialFromCodedStream
          (NonMaximumSuppressionLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  uint32 uVar4;
  char cVar5;
  ulong uVar6;
  float *value;
  
  do {
    pbVar2 = input->buffer_;
    uVar4 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar4 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00526739;
      input->buffer_ = pbVar2 + 1;
      uVar6 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00526739:
      uVar4 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar4);
      uVar6 = 0;
      if (uVar4 - 1 < 0x7f) {
        uVar6 = 0x100000000;
      }
      uVar6 = uVar4 | uVar6;
    }
    uVar4 = (uint32)uVar6;
    if ((uVar6 & 0x100000000) == 0) goto switchD_0052678b_default;
    cVar5 = (char)uVar6;
    switch((uint)(uVar6 >> 3) & 0x1fffffff) {
    case 1:
      value = &this->iouthreshold_;
      if (cVar5 != '\r') break;
LAB_005267ce:
      bVar3 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                        (input,value);
      goto LAB_00526772;
    case 2:
      value = &this->scorethreshold_;
      if (cVar5 == '\x15') goto LAB_005267ce;
      break;
    case 3:
      if (cVar5 == '\x18') {
        bVar3 = google::protobuf::io::CodedInputStream::ReadVarint64(input,&this->maxboxes_);
        goto LAB_00526772;
      }
      break;
    case 4:
      if (cVar5 == ' ') {
        bVar3 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,&this->perclasssuppression_);
        goto LAB_00526772;
      }
    }
switchD_0052678b_default:
    if (uVar4 == 0) {
      return true;
    }
    if ((uVar4 & 7) == 4) {
      return true;
    }
    bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar4);
LAB_00526772:
    if (bVar3 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NonMaximumSuppressionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NonMaximumSuppressionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float iouThreshold = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &iouthreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float scoreThreshold = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scorethreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 maxBoxes = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &maxboxes_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool perClassSuppression = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &perclasssuppression_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NonMaximumSuppressionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NonMaximumSuppressionLayerParams)
  return false;
#undef DO_
}